

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

void dmrC_kill_use(dmr_C *C,pseudo_t *usep)

{
  pseudo_t p_00;
  pseudo_t p;
  pseudo_t *usep_local;
  dmr_C *C_local;
  
  if (usep != (pseudo_t *)0x0) {
    p_00 = *usep;
    *usep = &C->L->void_pseudo;
    remove_usage(C,p_00,usep);
  }
  return;
}

Assistant:

void dmrC_kill_use(struct dmr_C *C, pseudo_t *usep)
{
	if (usep) {
		pseudo_t p = *usep;
		*usep = VOID_PSEUDO(C);
		remove_usage(C, p, usep);
	}
}